

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(defV *data,bool *val)

{
  string_view val_00;
  string_view val_01;
  size_t in_RAX;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar1;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__z;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *__lhs;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *vec;
  variant_alternative_t<5UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *vec_00;
  char *unaff_RBX;
  bool bVar3;
  double dVar4;
  
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    pvVar1 = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    bVar3 = *pvVar1 == 0.0;
    goto LAB_001c4be4;
  default:
    pvVar2 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    bVar3 = *pvVar2 == 0;
LAB_001c4be4:
    bVar3 = !bVar3;
    break;
  case '\x02':
    std::
    get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              (data);
    val_01._M_str = unaff_RBX;
    val_01._M_len = in_RAX;
    bVar3 = helicsBoolValue(val_01);
    break;
  case '\x03':
    __z = std::
          get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                    (data);
    dVar4 = std::abs<double>(__z);
    bVar3 = 0.0 < dVar4;
    break;
  case '\x04':
    vec = std::
          get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                    (data);
    dVar4 = vectorNorm(vec);
    goto LAB_001c4c18;
  case '\x05':
    vec_00 = std::
             get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    dVar4 = vectorNorm(vec_00);
LAB_001c4c18:
    bVar3 = (bool)(-(dVar4 != 0.0) & 1);
    break;
  case '\x06':
    __lhs = std::
            get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                      (data);
    if ((__lhs->name)._M_string_length == 0) {
      *val = true;
    }
    else {
      val_00._M_str = unaff_RBX;
      val_00._M_len = in_RAX;
      bVar3 = helicsBoolValue(val_00);
      *val = bVar3;
      if (!bVar3) {
        return;
      }
    }
    bVar3 = std::operator==(&__lhs->name,"value");
    if ((!bVar3) && ((__lhs->name)._M_string_length != 0)) {
      return;
    }
    if (__lhs->value != 0.0) {
      return;
    }
    if (NAN(__lhs->value)) {
      return;
    }
    bVar3 = false;
  }
  *val = bVar3;
  return;
}

Assistant:

void valueExtract(const defV& data, bool& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = std::abs(std::get<double>(data)) > 0.0;
            break;
        case int_loc:  // int64_t
        default:
            val = (std::get<int64_t>(data) != 0);
            break;
        case string_loc:  // string
        {
            const auto& str = std::get<std::string>(data);
            val = helicsBoolValue(str);
            break;
        }
        case complex_loc:  // complex
            val = std::abs(std::get<std::complex<double>>(data)) > 0.0;
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val = vectorNorm(vec) != 0.0;
            break;
        }
        case complex_vector_loc: {
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            val = vectorNorm(vec) != 0.0;
            break;
        }
        case named_point_loc: {
            const auto& point = std::get<NamedPoint>(data);
            const auto& str = point.name;
            val = str.empty() || helicsBoolValue(str);
            if (val) {
                if ((str == "value" || str.empty()) && point.value == 0.0) {
                    val = false;
                }
            }
        } break;
    }
}